

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O0

void wallet::feebumper::feebumper_tests::CheckMaxWeightComputation
               (string *script_str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *witness_str_stack,string *prevout_script_str,int64_t expected_max_weight)

{
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  Txid hashPrevTx;
  bool bVar1;
  unit_test_log_t *this;
  CScript *in_RSI;
  long in_FS_OFFSET;
  __sv_type _Var2;
  bool script_ok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  SignatureWeightChecker size_checker;
  SignatureWeights weights;
  int64_t weight;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prevout_script_data;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_data;
  CScript prevout_script;
  CTxIn input;
  CScript script;
  transaction_identifier<false> *in_stack_fffffffffffffc98;
  CTxIn *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffca0;
  lazy_ostream *prev;
  char *txin;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffcb0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  lazy_ostream *in_stack_fffffffffffffcc8;
  const_string *in_stack_fffffffffffffcd0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  undefined8 in_stack_fffffffffffffce8;
  uint32_t nOut;
  CTxIn *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  ScriptError *serror;
  undefined8 in_stack_fffffffffffffd48;
  BaseSignatureChecker *checker;
  __sv_type in_stack_fffffffffffffd50;
  undefined1 auVar3 [12];
  reference in_stack_fffffffffffffd60;
  const_string local_1f8 [2];
  assertion_result local_1b8 [4];
  int64_t local_158 [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  lazy_ostream local_f8 [4];
  CTxIn *local_b0;
  lazy_ostream *plStack_a8;
  CTxIn *local_a0;
  uchar *puStack_98;
  long local_8;
  
  nOut = (uint32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcb8._M_current);
  hex_str._M_str = in_stack_fffffffffffffd08;
  hex_str._M_len = in_stack_fffffffffffffd00;
  ParseHex<unsigned_char>(hex_str);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffca0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffca0);
  CScript::
  CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((CScript *)in_stack_fffffffffffffc98,in_stack_fffffffffffffcb8,
             in_stack_fffffffffffffcb0);
  transaction_identifier<false>::transaction_identifier(in_stack_fffffffffffffc98);
  CScript::CScript((CScript *)in_stack_fffffffffffffc98,(CScript *)0xda7cc7);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_fffffffffffffd38;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       (char)((ulong)in_stack_fffffffffffffd38 >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((ulong)in_stack_fffffffffffffd38 >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((ulong)in_stack_fffffffffffffd38 >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       (char)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((ulong)in_stack_fffffffffffffd38 >> 0x28);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((ulong)in_stack_fffffffffffffd38 >> 0x30);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((ulong)in_stack_fffffffffffffd38 >> 0x38);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffffd30;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       (char)((ulong)in_stack_fffffffffffffd30 >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       (char)((ulong)in_stack_fffffffffffffd30 >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       (char)((ulong)in_stack_fffffffffffffd30 >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       (char)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       (char)((ulong)in_stack_fffffffffffffd30 >> 0x28);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       (char)((ulong)in_stack_fffffffffffffd30 >> 0x30);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       (char)((ulong)in_stack_fffffffffffffd30 >> 0x38);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_stack_fffffffffffffd40
  ;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       (char)((ulong)in_stack_fffffffffffffd40 >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       (char)((ulong)in_stack_fffffffffffffd40 >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       (char)((ulong)in_stack_fffffffffffffd40 >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       (char)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       (char)((ulong)in_stack_fffffffffffffd40 >> 0x28);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       (char)((ulong)in_stack_fffffffffffffd40 >> 0x30);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       (char)((ulong)in_stack_fffffffffffffd40 >> 0x38);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_stack_fffffffffffffd48
  ;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       (char)((ulong)in_stack_fffffffffffffd48 >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       (char)((ulong)in_stack_fffffffffffffd48 >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       (char)((ulong)in_stack_fffffffffffffd48 >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       (char)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       (char)((ulong)in_stack_fffffffffffffd48 >> 0x28);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       (char)((ulong)in_stack_fffffffffffffd48 >> 0x30);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       (char)((ulong)in_stack_fffffffffffffd48 >> 0x38);
  CTxIn::CTxIn(in_stack_fffffffffffffcf0,hashPrevTx,nOut,
               (CScript *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
               (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  CScript::~CScript((CScript *)local_b0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)plStack_a8);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)plStack_a8);
  this_00 = local_b0;
  prev = plStack_a8;
  txin = (char *)local_a0;
  last._M_current = puStack_98;
  while( true ) {
    auVar3 = in_stack_fffffffffffffd50._4_12_;
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)txin,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)prev);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_fffffffffffffd60 =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this_00);
    in_stack_fffffffffffffd50 =
         std::__cxx11::string::operator_cast_to_basic_string_view
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffcb8._M_current);
    hex_str_00._M_str = in_stack_fffffffffffffd08;
    hex_str_00._M_len = in_stack_fffffffffffffd00;
    ParseHex<unsigned_char>(hex_str_00);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)this_00,(value_type *)0xda7dde);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)txin);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00);
  }
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcb8._M_current);
  serror = (ScriptError *)_Var2._M_len;
  checker = (BaseSignatureChecker *)_Var2._M_str;
  hex_str_01._M_str = in_stack_fffffffffffffd08;
  hex_str_01._M_len = in_stack_fffffffffffffd00;
  ParseHex<unsigned_char>(hex_str_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)prev);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)prev);
  CScript::
  CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((CScript *)this_00,in_stack_fffffffffffffcb8,last);
  local_158[0] = GetTransactionInputWeight((CTxIn *)txin);
  SignatureWeights::SignatureWeights((SignatureWeights *)this_00);
  SignatureWeightChecker::SignatureWeightChecker
            ((SignatureWeightChecker *)txin,(SignatureWeights *)prev,(BaseSignatureChecker *)this_00
            );
  VerifyScript(in_RSI,(CScript *)in_stack_fffffffffffffd60,auVar3._4_8_,auVar3._0_4_,checker,serror)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)txin,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8
               ,(const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)txin,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)txin,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)txin,(pointer)prev,(unsigned_long)this_00);
    this_00 = (CTxIn *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b8,(lazy_ostream *)&stack0xfffffffffffffe28,local_1f8,0x25,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  this = (unit_test_log_t *)SignatureWeights::GetWeightDiffToMax((SignatureWeights *)this_00);
  local_158[0] = (long)&(this->super_test_observer)._vptr_test_observer + local_158[0];
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)txin,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,file,(size_t)in_stack_fffffffffffffcc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    in_stack_fffffffffffffcc8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)txin,(pointer)prev,(unsigned_long)this_00);
    txin = "expected_max_weight";
    prev = local_f8;
    this_00 = (CTxIn *)0x1d28037;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&stack0xfffffffffffffdc8,&stack0xfffffffffffffdb8,0x27,1,2,local_158);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    in_stack_fffffffffffffcc7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffcc7);
  CScript::~CScript((CScript *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)txin);
  CTxIn::~CTxIn(this_00);
  CScript::~CScript((CScript *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)txin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckMaxWeightComputation(const std::string& script_str, const std::vector<std::string>& witness_str_stack, const std::string& prevout_script_str, int64_t expected_max_weight)
{
    std::vector script_data(ParseHex(script_str));
    CScript script(script_data.begin(), script_data.end());
    CTxIn input(Txid{}, 0, script);

    for (const auto& s : witness_str_stack) {
        input.scriptWitness.stack.push_back(ParseHex(s));
    }

    std::vector prevout_script_data(ParseHex(prevout_script_str));
    CScript prevout_script(prevout_script_data.begin(), prevout_script_data.end());

    int64_t weight = GetTransactionInputWeight(input);
    SignatureWeights weights;
    SignatureWeightChecker size_checker(weights, DUMMY_CHECKER);
    bool script_ok = VerifyScript(input.scriptSig, prevout_script, &input.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, size_checker);
    BOOST_CHECK(script_ok);
    weight += weights.GetWeightDiffToMax();
    BOOST_CHECK_EQUAL(weight, expected_max_weight);
}